

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsBuilder.cpp
# Opt level: O1

TQualifierIndex __thiscall
Refal2::COperationsBuilder::registerQualifier(COperationsBuilder *this,CQualifier *qualifier)

{
  CQualifier *pCVar1;
  CQualifier *this_00;
  
  pCVar1 = registerQualifier::last;
  if (registerQualifier::last != qualifier) {
    this_00 = (CQualifier *)operator_new(0x48);
    CQualifier::CQualifier(this_00);
    pCVar1 = qualifier;
    registerQualifier::newQualifier = this_00;
    if (this_00 != qualifier) {
      CQualifier::Swap(qualifier,this_00);
      CQualifier::Empty(qualifier);
      pCVar1 = qualifier;
    }
  }
  registerQualifier::last = pCVar1;
  return registerQualifier::newQualifier;
}

Assistant:

TQualifierIndex COperationsBuilder::registerQualifier( CQualifier& qualifier )
{
	static CQualifier* last = 0;
	static CQualifier* newQualifier = 0;
	if( last != &qualifier ) {
		newQualifier = new CQualifier;
		qualifier.Move( *newQualifier );
		last = &qualifier;
	}
	return newQualifier;
}